

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O3

int lj_cf_package_loader_lua(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
  pcVar2 = findfile(L,pcVar2,"path");
  if (pcVar2 != (char *)0x0) {
    iVar1 = luaL_loadfile(L,pcVar2);
    if (iVar1 != 0) {
      loaderror(L,pcVar2);
    }
  }
  return 1;
}

Assistant:

static int lj_cf_package_loader_lua(lua_State *L)
{
  const char *filename;
  const char *name = luaL_checkstring(L, 1);
  filename = findfile(L, name, "path");
  if (filename == NULL) return 1;  /* library not found in this path */
  if (luaL_loadfile(L, filename) != 0)
    loaderror(L, filename);
  return 1;  /* library loaded successfully */
}